

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

value * __thiscall
mjs::interpreter::impl::get_value(value *__return_storage_ptr__,impl *this,value *v)

{
  reference *p;
  undefined8 *puVar1;
  wostream *pwVar2;
  native_error_exception *this_00;
  wstring local_210;
  object_ptr b;
  wstring_view local_1e0;
  wstring_view local_1d0 [2];
  wstring_view local_1b0;
  wostringstream woss;
  
  if (v->type_ == reference) {
    p = value::reference_value(v);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&b.super_gc_heap_ptr_untyped,(gc_heap_ptr_untyped *)p);
    if (b.super_gc_heap_ptr_untyped.heap_ == (gc_heap *)0x0) {
      std::__cxx11::wostringstream::wostringstream((wostringstream *)&woss);
      local_1d0[0] = string::view(&p->property_name_);
      cpp_quote_abi_cxx11_(&local_210,(mjs *)local_1d0,(wstring_view *)local_1d0[0]._M_str);
      pwVar2 = std::operator<<((wostream *)&woss,(wstring *)&local_210);
      std::operator<<(pwVar2," is not defined");
      std::__cxx11::wstring::~wstring((wstring *)&local_210);
      this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
      stack_trace_abi_cxx11_(&local_210,this);
      local_1e0._M_len = local_210._M_string_length;
      local_1e0._M_str = local_210._M_dataplus._M_p;
      std::__cxx11::wstringbuf::str();
      local_1b0._M_len = (size_t)local_1d0[0]._M_str;
      local_1b0._M_str = (wchar_t *)local_1d0[0]._M_len;
      native_error_exception::native_error_exception(this_00,reference,&local_1e0,&local_1b0);
      __cxa_throw(this_00,&native_error_exception::typeinfo,
                  native_error_exception::~native_error_exception);
    }
    puVar1 = (undefined8 *)gc_heap_ptr_untyped::get(&b.super_gc_heap_ptr_untyped);
    _woss = string::view(&p->property_name_);
    (**(code **)*puVar1)(__return_storage_ptr__,puVar1,&woss);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&b.super_gc_heap_ptr_untyped);
  }
  else {
    value::value(__return_storage_ptr__,v);
  }
  return __return_storage_ptr__;
}

Assistant:

value get_value(const value& v) const {
        if (v.type() != value_type::reference) {
            return v;
        }
        auto& r = v.reference_value();
        auto b = r.base();
        if (!b) {
            std::wostringstream woss;
            woss << cpp_quote(r.property_name().view()) << " is not defined";
            throw native_error_exception{native_error_type::reference, stack_trace(), woss.str()};
        }
        return b->get(r.property_name().view());
    }